

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.c
# Opt level: O0

void ucopy(video *vvp,video *pvp)

{
  video *pvp_local;
  video *vvp_local;
  
  vvp->v_flag = vvp->v_flag & 0xfffe;
  pvp->v_flag = vvp->v_flag;
  pvp->v_hash = vvp->v_hash;
  pvp->v_cost = vvp->v_cost;
  pvp->v_color = vvp->v_color;
  memmove(pvp->v_text,vvp->v_text,(long)ncol);
  return;
}

Assistant:

void
ucopy(struct video *vvp, struct video *pvp)
{
	vvp->v_flag &= ~VFCHG;		/* Changes done.	 */
	pvp->v_flag = vvp->v_flag;	/* Update model.	 */
	pvp->v_hash = vvp->v_hash;
	pvp->v_cost = vvp->v_cost;
	pvp->v_color = vvp->v_color;
	bcopy(vvp->v_text, pvp->v_text, ncol);
}